

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

StringPtr * __thiscall
kj::
Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
::insert(Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
         *this,StringPtr *row)

{
  StringPtr *pSVar1;
  size_t sVar2;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)this,*(long *)(this + 8) - *(long *)this >> 4,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pSVar1 = *(StringPtr **)(this + 8);
    if (pSVar1 == *(StringPtr **)(this + 0x10)) {
      sVar2 = 4;
      if (pSVar1 != *(StringPtr **)this) {
        sVar2 = (long)pSVar1 - (long)*(StringPtr **)this >> 3;
      }
      Vector<kj::StringPtr>::setCapacity((Vector<kj::StringPtr> *)this,sVar2);
      pSVar1 = *(StringPtr **)(this + 8);
    }
    sVar2 = (row->content).size_;
    (pSVar1->content).ptr = (row->content).ptr;
    (pSVar1->content).size_ = sVar2;
    *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
    return pSVar1;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}